

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O1

void __thiscall irr::scene::CXMeshFileLoader::readUntilEndOfLine(CXMeshFileLoader *this)

{
  char *pcVar1;
  char *pcVar2;
  
  if (this->BinaryFormat == false) {
    pcVar2 = *(char **)&(this->super_IMeshLoader).field_0x18;
    pcVar1 = this->End;
    if (pcVar2 < pcVar1) {
      do {
        if ((*pcVar2 == '\r') || (*pcVar2 == '\n')) {
          *(char **)&(this->super_IMeshLoader).field_0x18 = pcVar2 + 1;
          this->Line = this->Line + 1;
          return;
        }
        pcVar2 = pcVar2 + 1;
        *(char **)&(this->super_IMeshLoader).field_0x18 = pcVar2;
      } while (pcVar2 != pcVar1);
    }
  }
  return;
}

Assistant:

void CXMeshFileLoader::readUntilEndOfLine()
{
	if (BinaryFormat)
		return;

	while (P < End) {
		if (P[0] == '\n' || P[0] == '\r') {
			++P;
			++Line;
			return;
		}

		++P;
	}
}